

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O3

uint SOIL_load_OGL_cubemap_from_memory
               (uchar *x_pos_buffer,int x_pos_buffer_length,uchar *x_neg_buffer,
               int x_neg_buffer_length,uchar *y_pos_buffer,int y_pos_buffer_length,
               uchar *y_neg_buffer,int y_neg_buffer_length,uchar *z_pos_buffer,
               int z_pos_buffer_length,uchar *z_neg_buffer,int z_neg_buffer_length,
               int force_channels,uint reuse_texture_ID,uint flags)

{
  uint uVar1;
  stbi_uc *psVar2;
  int iVar3;
  undefined1 auVar4 [16];
  int channels;
  int height;
  int width;
  uint local_34;
  
  auVar4._0_4_ = -(uint)(x_pos_buffer == (uchar *)0x0);
  auVar4._4_4_ = -(uint)(x_neg_buffer == (uchar *)0x0);
  auVar4._8_4_ = -(uint)(y_pos_buffer == (uchar *)0x0);
  auVar4._12_4_ = -(uint)(y_neg_buffer == (uchar *)0x0);
  iVar3 = movmskps((int)x_neg_buffer,auVar4);
  if ((z_neg_buffer == (uchar *)0x0 || z_pos_buffer == (uchar *)0x0) || iVar3 != 0) {
    result_string_pointer = "Invalid cube map buffers list";
  }
  else {
    iVar3 = query_cubemap_capability();
    if (iVar3 == 1) {
      psVar2 = stbi_load_from_memory
                         (x_pos_buffer,x_pos_buffer_length,&width,&height,&channels,force_channels);
      if (psVar2 == (stbi_uc *)0x0) {
        result_string_pointer = stbi_failure_reason();
      }
      else {
        result_string_pointer = "Image loaded from memory";
      }
      local_34 = force_channels - 1;
      if (local_34 < 4) {
        channels = force_channels;
      }
      if (psVar2 != (stbi_uc *)0x0) {
        uVar1 = SOIL_internal_create_OGL_texture
                          (psVar2,width,height,channels,reuse_texture_ID,flags,0x8513,0x8515,0x851c)
        ;
        free(psVar2);
        if (uVar1 == 0) {
          return 0;
        }
        psVar2 = stbi_load_from_memory
                           (x_neg_buffer,x_neg_buffer_length,&width,&height,&channels,force_channels
                           );
        if (psVar2 == (stbi_uc *)0x0) {
          result_string_pointer = stbi_failure_reason();
        }
        else {
          result_string_pointer = "Image loaded from memory";
        }
        if (local_34 < 4) {
          channels = force_channels;
        }
        if (psVar2 != (stbi_uc *)0x0) {
          uVar1 = SOIL_internal_create_OGL_texture
                            (psVar2,width,height,channels,uVar1,flags,0x8513,0x8516,0x851c);
          free(psVar2);
          if (uVar1 == 0) {
            return 0;
          }
          psVar2 = stbi_load_from_memory
                             (y_pos_buffer,y_pos_buffer_length,&width,&height,&channels,
                              force_channels);
          if (psVar2 == (stbi_uc *)0x0) {
            result_string_pointer = stbi_failure_reason();
          }
          else {
            result_string_pointer = "Image loaded from memory";
          }
          if (local_34 < 4) {
            channels = force_channels;
          }
          if (psVar2 != (stbi_uc *)0x0) {
            uVar1 = SOIL_internal_create_OGL_texture
                              (psVar2,width,height,channels,uVar1,flags,0x8513,0x8517,0x851c);
            free(psVar2);
            if (uVar1 == 0) {
              return 0;
            }
            psVar2 = stbi_load_from_memory
                               (y_neg_buffer,y_neg_buffer_length,&width,&height,&channels,
                                force_channels);
            if (psVar2 == (stbi_uc *)0x0) {
              result_string_pointer = stbi_failure_reason();
            }
            else {
              result_string_pointer = "Image loaded from memory";
            }
            if (local_34 < 4) {
              channels = force_channels;
            }
            if (psVar2 != (stbi_uc *)0x0) {
              uVar1 = SOIL_internal_create_OGL_texture
                                (psVar2,width,height,channels,uVar1,flags,0x8513,0x8518,0x851c);
              free(psVar2);
              if (uVar1 == 0) {
                return 0;
              }
              psVar2 = stbi_load_from_memory
                                 (z_pos_buffer,z_pos_buffer_length,&width,&height,&channels,
                                  force_channels);
              if (psVar2 == (stbi_uc *)0x0) {
                result_string_pointer = stbi_failure_reason();
              }
              else {
                result_string_pointer = "Image loaded from memory";
              }
              if (local_34 < 4) {
                channels = force_channels;
              }
              if (psVar2 != (stbi_uc *)0x0) {
                uVar1 = SOIL_internal_create_OGL_texture
                                  (psVar2,width,height,channels,uVar1,flags,0x8513,0x8519,0x851c);
                free(psVar2);
                if (uVar1 == 0) {
                  return 0;
                }
                psVar2 = stbi_load_from_memory
                                   (z_neg_buffer,z_neg_buffer_length,&width,&height,&channels,
                                    force_channels);
                if (psVar2 == (stbi_uc *)0x0) {
                  result_string_pointer = stbi_failure_reason();
                }
                else {
                  result_string_pointer = "Image loaded from memory";
                }
                if (local_34 < 4) {
                  channels = force_channels;
                }
                if (psVar2 != (stbi_uc *)0x0) {
                  uVar1 = SOIL_internal_create_OGL_texture
                                    (psVar2,width,height,channels,uVar1,flags,0x8513,0x851a,0x851c);
                  free(psVar2);
                  return uVar1;
                }
              }
            }
          }
        }
        result_string_pointer = stbi_failure_reason();
        return 0;
      }
      result_string_pointer = stbi_failure_reason();
    }
    else {
      result_string_pointer = "No cube map capability present";
    }
  }
  return 0;
}

Assistant:

unsigned int
	SOIL_load_OGL_cubemap_from_memory
	(
		const unsigned char *const x_pos_buffer,
		int x_pos_buffer_length,
		const unsigned char *const x_neg_buffer,
		int x_neg_buffer_length,
		const unsigned char *const y_pos_buffer,
		int y_pos_buffer_length,
		const unsigned char *const y_neg_buffer,
		int y_neg_buffer_length,
		const unsigned char *const z_pos_buffer,
		int z_pos_buffer_length,
		const unsigned char *const z_neg_buffer,
		int z_neg_buffer_length,
		int force_channels,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	error checking	*/
	if( (x_pos_buffer == NULL) ||
		(x_neg_buffer == NULL) ||
		(y_pos_buffer == NULL) ||
		(y_neg_buffer == NULL) ||
		(z_pos_buffer == NULL) ||
		(z_neg_buffer == NULL) )
	{
		result_string_pointer = "Invalid cube map buffers list";
		return 0;
	}
	/*	capability checking	*/
	if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
	{
		result_string_pointer = "No cube map capability present";
		return 0;
	}
	/*	1st face: try to load the image	*/
	img = SOIL_load_image_from_memory(
			x_pos_buffer, x_pos_buffer_length,
			&width, &height, &channels, force_channels );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( (force_channels >= 1) && (force_channels <= 4) )
	{
		channels = force_channels;
	}
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/*	upload the texture, and create a texture ID if necessary	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_X,
			SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image_from_memory(
				x_neg_buffer, x_neg_buffer_length,
				&width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image_from_memory(
				y_pos_buffer, y_pos_buffer_length,
				&width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image_from_memory(
				y_neg_buffer, y_neg_buffer_length,
				&width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image_from_memory(
				z_pos_buffer, z_pos_buffer_length,
				&width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	continue?	*/
	if( tex_id != 0 )
	{
		/*	1st face: try to load the image	*/
		img = SOIL_load_image_from_memory(
				z_neg_buffer, z_neg_buffer_length,
				&width, &height, &channels, force_channels );
		/*	channels holds the original number of channels, which may have been forced	*/
		if( (force_channels >= 1) && (force_channels <= 4) )
		{
			channels = force_channels;
		}
		if( NULL == img )
		{
			/*	image loading failed	*/
			result_string_pointer = stbi_failure_reason();
			return 0;
		}
		/*	upload the texture, but reuse the assigned texture ID	*/
		tex_id = SOIL_internal_create_OGL_texture(
				img, width, height, channels,
				tex_id, flags,
				SOIL_TEXTURE_CUBE_MAP, SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
				SOIL_MAX_CUBE_MAP_TEXTURE_SIZE );
		/*	and nuke the image data	*/
		SOIL_free_image_data( img );
	}
	/*	and return the handle, such as it is	*/
	return tex_id;
}